

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArrayTest.cpp
# Opt level: O0

void __thiscall
compressed_array_check_random_access_check_Test::TestBody
          (compressed_array_check_random_access_check_Test *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  AssertHelper *this_00;
  AssertHelper *pAVar4;
  AssertionResult gtest_ar__2;
  uint32_t i_2;
  CompressedArray array3;
  AssertionResult gtest_ar__1;
  uint32_t i_1;
  CompressedArray array2;
  AssertionResult gtest_ar_;
  uint32_t i;
  CompressedArray array1;
  vector<Record,_std::allocator<Record>_> records;
  undefined6 in_stack_fffffffffffffa58;
  undefined1 in_stack_fffffffffffffa5e;
  undefined1 in_stack_fffffffffffffa5f;
  CompressedArray *in_stack_fffffffffffffa60;
  vector<Record,_std::allocator<Record>_> *in_stack_fffffffffffffa68;
  vector<Record,_std::allocator<Record>_> *in_stack_fffffffffffffa70;
  undefined8 in_stack_fffffffffffffa78;
  undefined1 *puVar5;
  undefined6 in_stack_fffffffffffffa80;
  undefined1 in_stack_fffffffffffffa86;
  undefined1 in_stack_fffffffffffffa87;
  reference in_stack_fffffffffffffa88;
  AssertHelper *in_stack_fffffffffffffa90;
  undefined8 in_stack_fffffffffffffa98;
  undefined1 *puVar6;
  const_iterator *in_stack_fffffffffffffaa0;
  const_iterator *this_01;
  undefined6 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaae;
  undefined1 in_stack_fffffffffffffaaf;
  reference in_stack_fffffffffffffab0;
  char *expected_predicate_value;
  char *actual_predicate_value;
  char *in_stack_fffffffffffffad0;
  AssertionResult *in_stack_fffffffffffffad8;
  AssertHelper *in_stack_fffffffffffffae0;
  vector<Record,_std::allocator<Record>_> *in_stack_fffffffffffffb28;
  CompressedArray *in_stack_fffffffffffffb30;
  AssertionResult local_498;
  uint local_484;
  vector<Record,_std::allocator<Record>_> local_3a0;
  string local_388 [151];
  undefined1 local_2f1;
  AssertionResult local_2f0;
  uint local_2dc;
  undefined1 local_1f8 [28];
  uint local_1dc;
  string local_1d8 [151];
  undefined1 local_141;
  AssertionResult local_140;
  uint local_12c;
  char local_38 [24];
  
  std::vector<Record,_std::allocator<Record>_>::vector
            ((vector<Record,_std::allocator<Record>_> *)0x110ffc);
  create_records_1();
  actual_predicate_value = &stack0xffffffffffffffe0;
  expected_predicate_value = local_38;
  std::vector<Record,_std::allocator<Record>_>::operator=
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  std::vector<Record,_std::allocator<Record>_>::~vector(in_stack_fffffffffffffa70);
  std::vector<Record,_std::allocator<Record>_>::vector
            ((vector<Record,_std::allocator<Record>_> *)in_stack_fffffffffffffab0,
             (vector<Record,_std::allocator<Record>_> *)
             CONCAT17(in_stack_fffffffffffffaaf,
                      CONCAT16(in_stack_fffffffffffffaae,in_stack_fffffffffffffaa8)));
  CompressedArray::CompressedArray(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  std::vector<Record,_std::allocator<Record>_>::~vector(in_stack_fffffffffffffa70);
  for (local_12c = 0; uVar2 = (ulong)local_12c,
      sVar3 = std::vector<Record,_std::allocator<Record>_>::size
                        ((vector<Record,_std::allocator<Record>_> *)&stack0xffffffffffffffe0),
      uVar2 < sVar3; local_12c = local_12c + 1) {
    in_stack_fffffffffffffab0 =
         std::vector<Record,_std::allocator<Record>_>::operator[]
                   ((vector<Record,_std::allocator<Record>_> *)&stack0xffffffffffffffe0,
                    (ulong)local_12c);
    CompressedArray::begin(in_stack_fffffffffffffa60);
    CompressedArray::const_iterator::operator+
              (in_stack_fffffffffffffaa0,(uint32_t)((ulong)in_stack_fffffffffffffa98 >> 0x20));
    in_stack_fffffffffffffaaf =
         check_same((Record *)in_stack_fffffffffffffa60,
                    (const_iterator *)
                    CONCAT17(in_stack_fffffffffffffa5f,
                             CONCAT16(in_stack_fffffffffffffa5e,in_stack_fffffffffffffa58)));
    local_141 = in_stack_fffffffffffffaaf;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffa60,
               (bool *)CONCAT17(in_stack_fffffffffffffa5f,
                                CONCAT16(in_stack_fffffffffffffa5e,in_stack_fffffffffffffa58)),
               (type *)0x11112f);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
    in_stack_fffffffffffffaae = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffa90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,actual_predicate_value,
                 expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffa90,(Type)((ulong)in_stack_fffffffffffffa88 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffa87,
                                  CONCAT16(in_stack_fffffffffffffa86,in_stack_fffffffffffffa80)),
                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20),(char *)in_stack_fffffffffffffa70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffae0,(Message *)in_stack_fffffffffffffad8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa60);
      std::__cxx11::string::~string(local_1d8);
      testing::Message::~Message((Message *)0x11126d);
    }
    local_1dc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1112fb);
    if (local_1dc != 0) goto LAB_0011198a;
  }
  create_records_2();
  this_01 = (const_iterator *)&stack0xffffffffffffffe0;
  puVar6 = local_1f8;
  std::vector<Record,_std::allocator<Record>_>::operator=
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  std::vector<Record,_std::allocator<Record>_>::~vector(in_stack_fffffffffffffa70);
  std::vector<Record,_std::allocator<Record>_>::vector
            ((vector<Record,_std::allocator<Record>_> *)in_stack_fffffffffffffab0,
             (vector<Record,_std::allocator<Record>_> *)
             CONCAT17(in_stack_fffffffffffffaaf,
                      CONCAT16(in_stack_fffffffffffffaae,in_stack_fffffffffffffaa8)));
  CompressedArray::CompressedArray(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  std::vector<Record,_std::allocator<Record>_>::~vector(in_stack_fffffffffffffa70);
  local_2dc = 0;
  while( true ) {
    this_00 = (AssertHelper *)(ulong)local_2dc;
    pAVar4 = (AssertHelper *)
             std::vector<Record,_std::allocator<Record>_>::size
                       ((vector<Record,_std::allocator<Record>_> *)&stack0xffffffffffffffe0);
    if (pAVar4 <= this_00) break;
    in_stack_fffffffffffffa88 =
         std::vector<Record,_std::allocator<Record>_>::operator[]
                   ((vector<Record,_std::allocator<Record>_> *)&stack0xffffffffffffffe0,
                    (ulong)local_2dc);
    CompressedArray::begin(in_stack_fffffffffffffa60);
    CompressedArray::const_iterator::operator+(this_01,(uint32_t)((ulong)puVar6 >> 0x20));
    in_stack_fffffffffffffa87 =
         check_same((Record *)in_stack_fffffffffffffa60,
                    (const_iterator *)
                    CONCAT17(in_stack_fffffffffffffa5f,
                             CONCAT16(in_stack_fffffffffffffa5e,in_stack_fffffffffffffa58)));
    local_2f1 = in_stack_fffffffffffffa87;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffa60,
               (bool *)CONCAT17(in_stack_fffffffffffffa5f,
                                CONCAT16(in_stack_fffffffffffffa5e,in_stack_fffffffffffffa58)),
               (type *)0x111469);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f0);
    in_stack_fffffffffffffa86 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,actual_predicate_value,
                 expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,(Type)((ulong)in_stack_fffffffffffffa88 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffa87,
                                  CONCAT16(in_stack_fffffffffffffa86,in_stack_fffffffffffffa80)),
                 (int)((ulong)in_stack_fffffffffffffa78 >> 0x20),(char *)in_stack_fffffffffffffa70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffae0,(Message *)in_stack_fffffffffffffad8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa60);
      std::__cxx11::string::~string(local_388);
      testing::Message::~Message((Message *)0x11158e);
    }
    local_1dc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x11161c);
    if (local_1dc != 0) goto LAB_0011197d;
    local_2dc = local_2dc + 1;
  }
  create_records_3();
  puVar5 = &stack0xffffffffffffffe0;
  in_stack_fffffffffffffa70 = &local_3a0;
  std::vector<Record,_std::allocator<Record>_>::operator=
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  std::vector<Record,_std::allocator<Record>_>::~vector(in_stack_fffffffffffffa70);
  std::vector<Record,_std::allocator<Record>_>::vector
            ((vector<Record,_std::allocator<Record>_> *)in_stack_fffffffffffffab0,
             (vector<Record,_std::allocator<Record>_> *)
             CONCAT17(in_stack_fffffffffffffaaf,
                      CONCAT16(in_stack_fffffffffffffaae,in_stack_fffffffffffffaa8)));
  CompressedArray::CompressedArray(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  std::vector<Record,_std::allocator<Record>_>::~vector(in_stack_fffffffffffffa70);
  local_484 = 0;
  while( true ) {
    uVar2 = (ulong)local_484;
    sVar3 = std::vector<Record,_std::allocator<Record>_>::size
                      ((vector<Record,_std::allocator<Record>_> *)&stack0xffffffffffffffe0);
    if (sVar3 <= uVar2) break;
    in_stack_fffffffffffffa60 =
         (CompressedArray *)
         std::vector<Record,_std::allocator<Record>_>::operator[]
                   ((vector<Record,_std::allocator<Record>_> *)&stack0xffffffffffffffe0,
                    (ulong)local_484);
    CompressedArray::begin(in_stack_fffffffffffffa60);
    CompressedArray::const_iterator::operator+(this_01,(uint32_t)((ulong)puVar6 >> 0x20));
    in_stack_fffffffffffffa5f =
         check_same((Record *)in_stack_fffffffffffffa60,
                    (const_iterator *)
                    CONCAT17(in_stack_fffffffffffffa5f,
                             CONCAT16(in_stack_fffffffffffffa5e,in_stack_fffffffffffffa58)));
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffa60,
               (bool *)CONCAT17(in_stack_fffffffffffffa5f,
                                CONCAT16(in_stack_fffffffffffffa5e,in_stack_fffffffffffffa58)),
               (type *)0x11178a);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_498);
    in_stack_fffffffffffffa5e = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,actual_predicate_value,
                 expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,(Type)((ulong)in_stack_fffffffffffffa88 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffa87,
                                  CONCAT16(in_stack_fffffffffffffa86,in_stack_fffffffffffffa80)),
                 (int)((ulong)puVar5 >> 0x20),(char *)in_stack_fffffffffffffa70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffae0,(Message *)in_stack_fffffffffffffad8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffa60);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffad0);
      testing::Message::~Message((Message *)0x1118a6);
    }
    local_1dc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x111931);
    if (local_1dc != 0) goto LAB_00111970;
    local_484 = local_484 + 1;
  }
  local_1dc = 0;
LAB_00111970:
  CompressedArray::~CompressedArray(in_stack_fffffffffffffa60);
LAB_0011197d:
  CompressedArray::~CompressedArray(in_stack_fffffffffffffa60);
LAB_0011198a:
  CompressedArray::~CompressedArray(in_stack_fffffffffffffa60);
  std::vector<Record,_std::allocator<Record>_>::~vector(in_stack_fffffffffffffa70);
  return;
}

Assistant:

TEST(compressed_array_check, random_access_check) {
    vector<Record> records;

    records = create_records_1();
    CompressedArray array1(records);
    for (uint32_t i = 0; i < records.size(); i++)
        ASSERT_TRUE(check_same(records[i], array1.begin() + i));

    records = create_records_2();
    CompressedArray array2(records);
    for (uint32_t i = 0; i < records.size(); i++)
        ASSERT_TRUE(check_same(records[i], array2.begin() + i));

    records = create_records_3();
    CompressedArray array3(records);
    for (uint32_t i = 0; i < records.size(); i++)
        ASSERT_TRUE(check_same(records[i], array3.begin() + i));
}